

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall
bytearray_undo_rec::bytearray_undo_rec
          (bytearray_undo_rec *this,CVmObjByteArray *arr,unsigned_long start_idx,unsigned_long cnt)

{
  undefined8 *puVar1;
  ulong in_RCX;
  uchar *in_RDX;
  CVmObjByteArray *in_RSI;
  size_t *in_RDI;
  size_t cur;
  bytearray_undo_bytes *p;
  bytearray_undo_bytes *tail;
  unsigned_long rem;
  unsigned_long idx;
  ulong local_48;
  undefined8 *local_38;
  ulong local_30;
  uchar *buf;
  
  *in_RDI = (size_t)in_RDX;
  in_RDI[1] = in_RCX;
  local_38 = (undefined8 *)0x0;
  in_RDI[2] = 0;
  buf = in_RDX;
  for (local_30 = in_RCX; local_30 != 0; local_30 = local_30 - local_48) {
    local_48 = 0x8000;
    if (local_30 < 0x8000) {
      local_48 = local_30;
    }
    puVar1 = (undefined8 *)malloc(local_48 + 0xf);
    if (local_38 == (undefined8 *)0x0) {
      in_RDI[2] = (size_t)puVar1;
    }
    else {
      *local_38 = puVar1;
    }
    *puVar1 = 0;
    CVmObjByteArray::copy_to_buf(in_RSI,buf,in_RCX,(size_t)in_RDX);
    in_RDX = in_RDX + local_48;
    local_38 = puVar1;
  }
  return;
}

Assistant:

bytearray_undo_rec(CVmObjByteArray *arr, unsigned long start_idx,
                       unsigned long cnt)
    {
        unsigned long idx;
        unsigned long rem;
        bytearray_undo_bytes *tail;

        /* remember the starting index and length of the saved data */
        idx_ = start_idx;
        cnt_ = cnt;
        
        /* store the original data in a linked list of byte blocks */
        for (idx = start_idx, rem = cnt, save_head_ = tail = 0 ;
             rem != 0 ; )
        {
            bytearray_undo_bytes *p;
            size_t cur;

            /* allocate up to 32k, or the amount remaining if lower */
            cur = 32768;
            if (cur > rem)
                cur = (size_t)rem;
            
            /* allocate a new block */
            p = (bytearray_undo_bytes *)t3malloc(
                sizeof(bytearray_undo_bytes) + cur - 1);

            /* link this block into our list */
            if (tail != 0)
                tail->nxt_ = p;
            else
                save_head_ = p;
            tail = p;
            p->nxt_ = 0;
                
            /* copy bytes into this block */
            arr->copy_to_buf(p->buf_, idx, cur);

            /* move past the copied bytes */
            idx += cur;
            rem -= cur;
        }
    }